

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void R_RenderViewToCanvas
               (AActor *actor,DCanvas *canvas,int x,int y,int width,int height,bool dontmaplines)

{
  bool bVar1;
  bool savedviewactive;
  bool dontmaplines_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  DCanvas *canvas_local;
  AActor *actor_local;
  
  bVar1 = viewactive;
  bRenderingToCanvas = true;
  RenderTarget = canvas;
  viewwidth = width;
  R_SetWindow(0xc,width,height,height);
  viewactive = true;
  viewwindowx = x;
  viewwindowy = y;
  R_RenderActorView(actor,dontmaplines);
  RenderTarget = (DCanvas *)screen;
  bRenderingToCanvas = false;
  R_ExecuteSetViewSize();
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,1);
  R_SetupBuffer();
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[9])();
  viewactive = bVar1;
  return;
}

Assistant:

void R_RenderViewToCanvas (AActor *actor, DCanvas *canvas,
	int x, int y, int width, int height, bool dontmaplines)
{
	const bool savedviewactive = viewactive;

	viewwidth = width;
	RenderTarget = canvas;
	bRenderingToCanvas = true;

	R_SetWindow (12, width, height, height);
	viewwindowx = x;
	viewwindowy = y;
	viewactive = true;

	R_RenderActorView (actor, dontmaplines);

	RenderTarget = screen;
	bRenderingToCanvas = false;
	R_ExecuteSetViewSize ();
	screen->Lock (true);
	R_SetupBuffer ();
	screen->Unlock ();
	viewactive = savedviewactive;
}